

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Identifier.h
# Opt level: O3

IdentifierPath * __thiscall
soul::IdentifierPath::getParentPath(IdentifierPath *__return_storage_ptr__,IdentifierPath *this)

{
  if ((this->pathSections).numActive < 2) {
    (__return_storage_ptr__->pathSections).items =
         (Identifier *)(__return_storage_ptr__->pathSections).space;
    (__return_storage_ptr__->pathSections).numActive = 0;
    (__return_storage_ptr__->pathSections).numAllocated = 8;
  }
  else {
    ArrayWithPreallocation<soul::Identifier,_8UL>::ArrayWithPreallocation
              (&__return_storage_ptr__->pathSections,&this->pathSections);
    ArrayWithPreallocation<soul::Identifier,_8UL>::pop_back(&__return_storage_ptr__->pathSections);
  }
  return __return_storage_ptr__;
}

Assistant:

IdentifierPath getParentPath() const
    {
        if (size() <= 1)
            return {};

        auto p = *this;
        p.pathSections.pop_back();
        return p;
    }